

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::SmallVector<spirv_cross::HLSLVertexAttributeRemap,_8UL>::clear
          (SmallVector<spirv_cross::HLSLVertexAttributeRemap,_8UL> *this)

{
  HLSLVertexAttributeRemap *pHVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  
  if ((this->super_VectorView<spirv_cross::HLSLVertexAttributeRemap>).buffer_size != 0) {
    lVar3 = 0x18;
    uVar4 = 0;
    do {
      pHVar1 = (this->super_VectorView<spirv_cross::HLSLVertexAttributeRemap>).ptr;
      pvVar2 = *(void **)((long)pHVar1 + lVar3 + -0x10);
      if ((void *)((long)&pHVar1->location + lVar3) != pvVar2) {
        operator_delete(pvVar2);
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x28;
    } while (uVar4 < (this->super_VectorView<spirv_cross::HLSLVertexAttributeRemap>).buffer_size);
  }
  (this->super_VectorView<spirv_cross::HLSLVertexAttributeRemap>).buffer_size = 0;
  return;
}

Assistant:

void clear() SPIRV_CROSS_NOEXCEPT
	{
		for (size_t i = 0; i < this->buffer_size; i++)
			this->ptr[i].~T();
		this->buffer_size = 0;
	}